

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

void display_object_recall_interactive(object *obj)

{
  textblock *tb;
  char header_buf [120];
  
  event_signal(EVENT_MESSAGE_FLUSH);
  tb = object_info(obj,OINFO_NONE);
  object_desc(header_buf,0x78,obj,0x43,player);
  textui_textblock_show(tb,(region)ZEXT816(0),header_buf);
  textblock_free(tb);
  return;
}

Assistant:

void display_object_recall_interactive(struct object *obj)
{
	char header_buf[120];
	textblock *tb;

	event_signal(EVENT_MESSAGE_FLUSH);

	tb = object_info(obj, OINFO_NONE);
	object_desc(header_buf, sizeof(header_buf), obj,
		ODESC_PREFIX | ODESC_FULL, player);
	textui_textblock_show(tb, SCREEN_REGION, header_buf);
	textblock_free(tb);
}